

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::ImplicitEventControlSyntax>
          (DeepCloneVisitor *this,ImplicitEventControlSyntax *node,BumpAllocator *alloc)

{
  ImplicitEventControlSyntax *pIVar1;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone(&node->at,alloc);
  local_48 = parsing::Token::deepClone(&node->openParen,alloc);
  local_58 = parsing::Token::deepClone(&node->star,alloc);
  local_68 = parsing::Token::deepClone(&node->closeParen,alloc);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImplicitEventControlSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_38,&local_48,&local_58,&local_68);
  return (SyntaxNode *)pIVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }